

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

void matd_scale_inplace(matd_t *a,double s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x114,"void matd_scale_inplace(matd_t *, double)");
  }
  uVar1 = a->ncols;
  uVar4 = (ulong)uVar1;
  if ((uVar4 < 2) && (a->nrows < 2)) {
    a[1] = (matd_t)(s * (double)a[1]);
    return;
  }
  uVar2 = a->nrows;
  if (uVar2 != 0) {
    uVar7 = 0;
    uVar6 = 0;
    uVar3 = uVar4;
    uVar5 = uVar7;
    do {
      for (; uVar3 != 0; uVar3 = uVar3 - 1) {
        a[(ulong)uVar7 + 1] = (matd_t)((double)a[(ulong)uVar7 + 1] * s);
        uVar7 = uVar7 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar7 = uVar5 + uVar1;
      uVar3 = uVar4;
      uVar5 = uVar7;
    } while (uVar6 != uVar2);
  }
  return;
}

Assistant:

void matd_scale_inplace(matd_t *a, double s)
{
    assert(a != NULL);

    if (matd_is_scalar(a)) {
        a->data[0] *= s;
        return;
    }

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(a, i, j) *= s;
        }
    }
}